

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O1

void * integrate_thread(void *arg)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *extraout_RAX;
  void *extraout_RAX_00;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  double *in_RSI;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double dVar12;
  undefined8 uStack_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_c0;
  vector<Argument,_std::allocator<Argument>_> vStack_a8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  void *pvStack_68;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  void *pvVar2;
  
  lVar7 = *(long *)((long)arg + 0x28);
  local_30 = *(double *)((long)arg + 0x10);
  if (*(long *)(lVar7 + 0x10) == 0) {
LAB_001026ed:
    dVar11 = (double)std::__throw_bad_function_call();
    iVar6 = (int)in_RSI;
    pvVar3 = (void *)((ulong)in_RSI & 0xffffffff);
    pvStack_68 = arg;
    std::vector<Argument,_std::allocator<Argument>_>::vector
              (&vStack_a8,(long)iVar6,(allocator_type *)&uStack_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&vStack_c0,(long)iVar6,(allocator_type *)&uStack_90);
    iVar5 = 0;
    uStack_70 = 0;
    uStack_80 = 0;
    uStack_78 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    uStack_c8 = 0;
    pvVar2 = pvVar3;
    if (0 < iVar6) {
      dVar10 = dVar11;
      if (dVar11 <= in_XMM1_Qa) {
        dVar10 = in_XMM1_Qa;
        in_XMM1_Qa = dVar11;
      }
      dVar11 = (dVar10 - in_XMM1_Qa) / (double)iVar6;
      lVar9 = 0x28;
      lVar8 = 0;
      do {
        dVar10 = (double)iVar5;
        iVar5 = iVar5 + 1;
        *(allocator_type **)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9 + -0x28) = (allocator_type *)&uStack_90;
        *(undefined8 **)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9 + -0x20) = &uStack_c8;
        *(double *)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9 + -0x18) = dVar10 * dVar11 + in_XMM1_Qa;
        *(double *)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9 + -0x10) =
             (double)iVar5 * dVar11 + in_XMM1_Qa;
        *(double *)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9 + -8) = in_XMM2_Qa;
        *(long *)((long)&(vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                          super__Vector_impl_data._M_start)->mutex + lVar9) = lVar7;
        iVar1 = pthread_create((pthread_t *)
                               ((long)vStack_c0.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar8),
                               (pthread_attr_t *)0x0,integrate_thread,
                               (void *)((long)vStack_a8.
                                              super__Vector_base<Argument,_std::allocator<Argument>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar9 + -0x28));
        pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
        lVar9 = lVar9 + 0x30;
        lVar8 = lVar8 + 8;
      } while ((long)pvVar3 * 8 - lVar8 != 0);
    }
    if (0 < iVar6) {
      pvVar4 = (void *)0x0;
      do {
        iVar5 = pthread_join(vStack_c0.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[(long)pvVar4],(void **)0x0);
        pvVar2 = (void *)CONCAT44(extraout_var_00,iVar5);
        pvVar4 = (void *)((long)pvVar4 + 1);
      } while (pvVar3 != pvVar4);
    }
    if (vStack_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      pvVar2 = extraout_RAX;
    }
    if (vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar2 = extraout_RAX_00;
    }
    return pvVar2;
  }
  in_RSI = &local_30;
  dVar10 = (double)(**(code **)(lVar7 + 0x18))();
  dVar11 = *(double *)((long)arg + 0x18);
  in_XMM1_Qa = *(double *)((long)arg + 0x20);
  dVar12 = 0.0;
  if (*(double *)((long)arg + 0x10) < in_XMM1_Qa * -0.5 + dVar11) {
    local_20 = *(double *)((long)arg + 0x10);
    do {
      local_18 = dVar10;
      local_28 = dVar11 - local_20;
      if (in_XMM1_Qa <= dVar11 - local_20) {
        local_28 = in_XMM1_Qa;
      }
      in_XMM2_Qa = local_20 + local_28;
      lVar7 = *(long *)((long)arg + 0x28);
      local_30 = in_XMM2_Qa;
      local_20 = in_XMM2_Qa;
      if (*(long *)(lVar7 + 0x10) == 0) goto LAB_001026ed;
      in_RSI = &local_30;
      dVar10 = (double)(**(code **)(lVar7 + 0x18))();
      dVar12 = dVar12 + local_28 * (local_18 + dVar10) * 0.5;
      dVar11 = *(double *)((long)arg + 0x18);
      in_XMM1_Qa = *(double *)((long)arg + 0x20);
    } while (local_20 < dVar11 - in_XMM1_Qa * 0.5);
  }
  pthread_mutex_lock(*arg);
  **(double **)((long)arg + 8) = dVar12 + **(double **)((long)arg + 8);
  pthread_mutex_unlock(*arg);
  return (void *)0x0;
}

Assistant:

void * integrate_thread(void * arg){
  auto p = reinterpret_cast<Argument *>(arg);
  double func = (*(p -> func))(p -> a), new_funk, t = p -> a;
  double res  = 0;
  while(t < p -> b - p-> h/2){
    auto h = std::min(p -> h, p -> b - t);
    t += h;
    new_funk = (*(p -> func))(t);
    res +=  (new_funk + func) * h / 2;
    func = new_funk;
  }
  pthread_mutex_lock(p->mutex);
  *(p -> result) += res;
  pthread_mutex_unlock(p->mutex);
  return nullptr;
}